

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::anon_unknown_1::TextureFragmentShader::shadeFragments
          (TextureFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  TextureFragmentShader *pTVar2;
  FragmentShadingContext *context_00;
  int i;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  FragmentPacket *packet;
  Vec4 texColor0;
  Vec4 color3;
  Vec4 color2;
  Vec4 color1;
  IVec2 position3;
  IVec2 position2;
  IVec2 position1;
  IVec2 position0;
  Vec4 color0;
  Vector<float,_4> res_10;
  Vec4 vtxColor3;
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  Vec4 vtxColor0;
  Vec4 texColor3;
  Vec4 texColor2;
  Vec4 texColor1;
  undefined1 local_158 [32];
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128 [4];
  int local_118 [8];
  float local_f8 [6];
  TextureFragmentShader *local_e0;
  FragmentPacket *local_d8;
  FragmentShadingContext *local_d0;
  ConstPixelBufferAccess *local_c8;
  ulong local_c0;
  float local_b8 [6];
  rr local_a0 [16];
  rr local_90 [16];
  rr local_80 [16];
  rr local_70 [16];
  undefined1 local_60 [48];
  
  if (0 < numPackets) {
    local_c0 = (ulong)(uint)numPackets;
    uVar7 = 0;
    local_e0 = this;
    local_d8 = packets;
    local_d0 = context;
    local_c8 = &this->m_texture;
    do {
      pTVar2 = local_e0;
      packet = local_d8 + uVar7;
      local_158._0_4_ = R;
      local_158._4_4_ = SNORM_INT8;
      local_118[6] = 0;
      local_118[7] = 0;
      lVar4 = 0;
      do {
        local_118[lVar4 + 6] = *(int *)(local_158 + lVar4 * 4) + (packets->position).m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      local_158._0_4_ = A;
      local_158._4_4_ = SNORM_INT8;
      local_118[4] = 0;
      local_118[5] = 0;
      lVar4 = 0;
      do {
        local_118[lVar4 + 4] = *(int *)(local_158 + lVar4 * 4) + (packets->position).m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      local_158._0_4_ = R;
      local_158._4_4_ = SNORM_INT16;
      local_118[2] = 0;
      local_118[3] = 0;
      lVar4 = 0;
      do {
        local_118[lVar4 + 2] = *(int *)(local_158 + lVar4 * 4) + (packets->position).m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      local_158._0_4_ = A;
      local_158._4_4_ = SNORM_INT16;
      local_118[0] = 0;
      local_118[1] = 0;
      lVar4 = 0;
      do {
        local_118[lVar4] = *(int *)(local_158 + lVar4 * 4) + (packets->position).m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      iVar3 = local_118[7] * local_118[6];
      iVar5 = (local_e0->m_texture).m_size.m_data[0] + -1;
      if (iVar3 < iVar5) {
        iVar5 = iVar3;
      }
      if (iVar3 < 0) {
        iVar5 = 0;
      }
      iVar6 = (int)&this->m_texture;
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_158,iVar6,iVar5,0);
      iVar3 = local_118[5] * local_118[4];
      iVar5 = (pTVar2->m_texture).m_size.m_data[0] + -1;
      if (iVar3 < iVar5) {
        iVar5 = iVar3;
      }
      if (iVar3 < 0) {
        iVar5 = 0;
      }
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(local_60 + 0x20),iVar6,iVar5,0);
      iVar3 = local_118[3] * local_118[2];
      iVar5 = (pTVar2->m_texture).m_size.m_data[0] + -1;
      if (iVar3 < iVar5) {
        iVar5 = iVar3;
      }
      if (iVar3 < 0) {
        iVar5 = 0;
      }
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(local_60 + 0x10),iVar6,iVar5,0);
      iVar3 = local_118[1] * local_118[0];
      iVar5 = (pTVar2->m_texture).m_size.m_data[0] + -1;
      if (iVar3 < iVar5) {
        iVar5 = iVar3;
      }
      if (iVar3 < 0) {
        iVar5 = 0;
      }
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_60,iVar6,iVar5,0);
      context_00 = local_d0;
      rr::readVarying<float>(local_70,packet,local_d0,0,0);
      rr::readVarying<float>(local_80,packet,context_00,0,1);
      rr::readVarying<float>(local_90,packet,context_00,0,2);
      rr::readVarying<float>(local_a0,packet,context_00,0,3);
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      local_128[3] = 0.0;
      lVar4 = 0;
      do {
        local_128[lVar4] = *(float *)(local_70 + lVar4 * 4) + *(float *)(local_158 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      lVar4 = 0;
      do {
        local_f8[lVar4] = local_128[lVar4] * 0.5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_138 = (void *)0x0;
      uStack_130 = 0;
      lVar4 = 0;
      do {
        *(float *)((long)&local_138 + lVar4 * 4) =
             *(float *)(local_80 + lVar4 * 4) + *(float *)(local_60 + lVar4 * 4 + 0x20);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      local_128[3] = 0.0;
      lVar4 = 0;
      do {
        local_128[lVar4] = *(float *)((long)&local_138 + lVar4 * 4) * 0.5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_158._16_4_ = 0;
      local_158._20_4_ = 0;
      local_158._24_4_ = 0;
      local_158._28_4_ = 0;
      lVar4 = 0;
      do {
        *(float *)(local_158 + lVar4 * 4 + 0x10) =
             *(float *)(local_90 + lVar4 * 4) + *(float *)(local_60 + lVar4 * 4 + 0x10);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_138 = (void *)0x0;
      uStack_130 = 0;
      lVar4 = 0;
      do {
        *(float *)((long)&local_138 + lVar4 * 4) = *(float *)(local_158 + lVar4 * 4 + 0x10) * 0.5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      lVar4 = 0;
      do {
        local_b8[lVar4] = *(float *)(local_a0 + lVar4 * 4) + *(float *)(local_60 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_158._16_4_ = 0;
      local_158._20_4_ = 0;
      local_158._24_4_ = 0;
      local_158._28_4_ = 0;
      lVar4 = 0;
      do {
        *(float *)(local_158 + lVar4 * 4 + 0x10) = local_b8[lVar4] * 0.5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pGVar1 = context_00->outputArray;
      iVar5 = context_00->numFragmentOutputs;
      iVar3 = (int)uVar7;
      iVar6 = iVar3 * 4 * iVar5;
      pGVar1[iVar6].v.fData[0] = local_f8[0] * local_f8[3];
      pGVar1[iVar6].v.fData[1] = local_f8[1] * local_f8[3];
      pGVar1[iVar6].v.fData[2] = local_f8[3] * local_f8[2];
      pGVar1[iVar6].v.uData[3] = 0x3f800000;
      iVar6 = (iVar3 * 4 + 1) * iVar5;
      pGVar1[iVar6].v.fData[0] = local_128[0] * local_128[3];
      pGVar1[iVar6].v.fData[1] = local_128[1] * local_128[3];
      pGVar1[iVar6].v.fData[2] = local_128[3] * local_128[2];
      pGVar1[iVar6].v.uData[3] = 0x3f800000;
      iVar6 = (iVar3 * 4 + 2) * iVar5;
      pGVar1[iVar6].v.fData[0] = (float)local_138 * uStack_130._4_4_;
      pGVar1[iVar6].v.fData[1] = local_138._4_4_ * uStack_130._4_4_;
      pGVar1[iVar6].v.fData[2] = uStack_130._4_4_ * (float)uStack_130;
      pGVar1[iVar6].v.uData[3] = 0x3f800000;
      iVar5 = (iVar3 * 4 + 3) * iVar5;
      pGVar1[iVar5].v.fData[0] = (float)local_158._16_4_ * (float)local_158._28_4_;
      pGVar1[iVar5].v.fData[1] = (float)local_158._20_4_ * (float)local_158._28_4_;
      pGVar1[iVar5].v.fData[2] = (float)local_158._28_4_ * (float)local_158._24_4_;
      pGVar1[iVar5].v.uData[3] = 0x3f800000;
      uVar7 = uVar7 + 1;
      packets = packets + 1;
    } while (uVar7 != local_c0);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::IVec2	position0	= packet.position + tcu::IVec2(0, 0);
			const tcu::IVec2	position1	= packet.position + tcu::IVec2(1, 0);
			const tcu::IVec2	position2	= packet.position + tcu::IVec2(0, 1);
			const tcu::IVec2	position3	= packet.position + tcu::IVec2(1, 1);

			const tcu::Vec4		texColor0	= m_texture.getPixel(de::clamp((position0.x() * position0.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor1	= m_texture.getPixel(de::clamp((position1.x() * position1.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor2	= m_texture.getPixel(de::clamp((position2.x() * position2.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor3	= m_texture.getPixel(de::clamp((position3.x() * position3.y()), 0, m_texture.getWidth()-1), 0);

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= 0.5f * (vtxColor0 + texColor0);
			const tcu::Vec4		color1		= 0.5f * (vtxColor1 + texColor1);
			const tcu::Vec4		color2		= 0.5f * (vtxColor2 + texColor2);
			const tcu::Vec4		color3		= 0.5f * (vtxColor3 + texColor3);

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}